

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

bool __thiscall pbrt::syntactic::ParamSet::hasParamString(ParamSet *this,string *name)

{
  undefined1 local_18 [16];
  
  findParam<std::__cxx11::string>((ParamSet *)local_18,(string *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return local_18._0_8_ != 0;
}

Assistant:

bool hasParamString(const std::string &name) const {
        return (bool)findParam<std::string>(name);
      }